

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int archive_read_format_rar_read_data_skip(archive_read *a)

{
  byte *pbVar1;
  int iVar2;
  int64_t iVar3;
  
  while( true ) {
    pbVar1 = (byte *)a->format->data;
    if (0 < *(long *)(pbVar1 + 0x98)) {
      __archive_read_consume(a,*(long *)(pbVar1 + 0x98));
      pbVar1[0x98] = 0;
      pbVar1[0x99] = 0;
      pbVar1[0x9a] = 0;
      pbVar1[0x9b] = 0;
      pbVar1[0x9c] = 0;
      pbVar1[0x9d] = 0;
      pbVar1[0x9e] = 0;
      pbVar1[0x9f] = 0;
    }
    if ((0 < *(long *)(pbVar1 + 0xa0)) &&
       (iVar3 = __archive_read_consume(a,*(long *)(pbVar1 + 0xa0)), iVar3 < 0)) {
      return -0x1e;
    }
    if ((*pbVar1 & 1) == 0) {
      return 0;
    }
    if ((pbVar1[0x18] & 2) == 0) break;
    iVar2 = archive_read_format_rar_read_header(a,a->entry);
    if (iVar2 == 1) {
      iVar2 = archive_read_format_rar_read_header(a,a->entry);
    }
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  return 0;
}

Assistant:

static int
archive_read_format_rar_read_data_skip(struct archive_read *a)
{
  struct rar *rar;
  int64_t bytes_skipped;
  int ret;

  rar = (struct rar *)(a->format->data);

  if (rar->bytes_unconsumed > 0) {
      /* Consume as much as the decompressor actually used. */
      __archive_read_consume(a, rar->bytes_unconsumed);
      rar->bytes_unconsumed = 0;
  }

  if (rar->bytes_remaining > 0) {
    bytes_skipped = __archive_read_consume(a, rar->bytes_remaining);
    if (bytes_skipped < 0)
      return (ARCHIVE_FATAL);
  }

  /* Compressed data to skip must be read from each header in a multivolume
   * archive.
   */
  if (rar->main_flags & MHD_VOLUME && rar->file_flags & FHD_SPLIT_AFTER)
  {
    ret = archive_read_format_rar_read_header(a, a->entry);
    if (ret == (ARCHIVE_EOF))
      ret = archive_read_format_rar_read_header(a, a->entry);
    if (ret != (ARCHIVE_OK))
      return ret;
    return archive_read_format_rar_read_data_skip(a);
  }

  return (ARCHIVE_OK);
}